

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<int,_true,_5>_> __thiscall
immutable::rrb_details::rrb_drop_left<int,true,5>
          (rrb_details *this,ref<immutable::rrb<int,_true,_5>_> *in,uint32_t left)

{
  __int_type _Var1;
  uint uVar2;
  rrb<int,_true,_5> *prVar3;
  void *__ptr;
  int *piVar4;
  tree_node<int,_true> *ptVar5;
  long lVar6;
  leaf_node<int,_true> *plVar7;
  ref<immutable::rrb<int,_true,_5>_> p_node;
  leaf_node<int,_true> *plVar8;
  rrb<int,_true,_5> *prVar9;
  leaf_node<int,_true> *plVar10;
  undefined8 *__ptr_00;
  undefined4 *__ptr_01;
  uint *puVar11;
  undefined8 *puVar12;
  leaf_node<int,_true> *plVar13;
  leaf_node<int,_true> *plVar14;
  int *piVar15;
  ulong uVar16;
  char *__function;
  ulong uVar17;
  uint uVar18;
  uint32_t uVar19;
  atomic<unsigned_int> *paVar20;
  tree_node<int,_true> *temp;
  uint uVar21;
  atomic<unsigned_int> *paVar22;
  ref<immutable::rrb<int,_true,_5>_> new_rrb;
  ref<immutable::rrb<int,_true,_5>_> local_50;
  ref<immutable::rrb<int,_true,_5>_> local_48;
  leaf_node<int,_true> *local_40;
  uint32_t local_38;
  __int_type local_34;
  
  prVar9 = in->ptr;
  if (prVar9 == (rrb<int,_true,_5> *)0x0) goto LAB_0011918b;
  uVar21 = prVar9->cnt;
  uVar18 = uVar21 - left;
  if (uVar21 < left || uVar18 == 0) {
    puVar12 = (undefined8 *)malloc(0x28);
    *puVar12 = 0;
    *(undefined4 *)(puVar12 + 1) = 0;
    __ptr_00 = (undefined8 *)malloc(0x18);
    puVar12[2] = 0;
    puVar12[3] = 0;
    *__ptr_00 = 0;
    __ptr_00[2] = 0;
    *(undefined4 *)((long)__ptr_00 + 0xc) = 0;
    LOCK();
    *(undefined4 *)(__ptr_00 + 1) = 1;
    UNLOCK();
    LOCK();
    *(int *)(__ptr_00 + 1) = *(int *)(__ptr_00 + 1) + 1;
    UNLOCK();
    puVar12[2] = __ptr_00;
    LOCK();
    piVar4 = (int *)(__ptr_00 + 1);
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      free(__ptr_00);
    }
    *(undefined8 **)this = puVar12;
    LOCK();
    *(undefined4 *)(puVar12 + 4) = 1;
    UNLOCK();
    return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
  }
  if (left != 0) {
    uVar2 = prVar9->tail_len;
    if (uVar18 <= uVar2) {
      uVar17 = (ulong)uVar18;
      local_40 = (leaf_node<int,_true> *)(uVar17 * 4);
      __ptr_01 = (undefined4 *)malloc(uVar17 * 4 + 0x18);
      __ptr_01[1] = uVar18;
      *__ptr_01 = 0;
      *(undefined4 **)(__ptr_01 + 4) = __ptr_01 + 6;
      __ptr_01[3] = 0;
      memset(__ptr_01 + 6,0,(size_t)local_40);
      LOCK();
      __ptr_01[2] = 1;
      UNLOCK();
      plVar10 = (prVar9->tail).ptr;
      if (plVar10 != (leaf_node<int,_true> *)0x0) {
        piVar15 = __ptr_01 + 2;
        piVar4 = plVar10->child;
        uVar16 = 0;
        do {
          __ptr_01[uVar16 + 6] = piVar4[(int)uVar16 + ((uVar2 + left) - uVar21)];
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
        puVar11 = (uint *)malloc(0x28);
        puVar11[0] = 0;
        puVar11[1] = 0;
        puVar11[2] = 0;
        puVar12 = (undefined8 *)malloc(0x18);
        puVar11[4] = 0;
        puVar11[5] = 0;
        puVar11[6] = 0;
        puVar11[7] = 0;
        *puVar12 = 0;
        puVar12[2] = 0;
        *(undefined4 *)((long)puVar12 + 0xc) = 0;
        LOCK();
        *(undefined4 *)(puVar12 + 1) = 1;
        UNLOCK();
        LOCK();
        *(int *)(puVar12 + 1) = *(int *)(puVar12 + 1) + 1;
        UNLOCK();
        *(undefined8 **)(puVar11 + 4) = puVar12;
        LOCK();
        piVar4 = (int *)(puVar12 + 1);
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          free(puVar12);
        }
        *(uint **)this = puVar11;
        LOCK();
        puVar11[8] = 1;
        UNLOCK();
        *puVar11 = uVar18;
        puVar11[2] = uVar18;
        LOCK();
        __ptr_01[2] = __ptr_01[2] + 1;
        UNLOCK();
        __ptr = *(void **)(puVar11 + 4);
        *(undefined4 **)(puVar11 + 4) = __ptr_01;
        if (__ptr != (void *)0x0) {
          LOCK();
          piVar4 = (int *)((long)__ptr + 8);
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            free(__ptr);
          }
        }
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 != 0) {
          return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
        }
        free(__ptr_01);
        return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
      }
      goto LAB_001191aa;
    }
    prVar9 = (rrb<int,_true,_5> *)malloc(0x28);
    prVar9->cnt = 0;
    prVar9->shift = 0;
    prVar9->tail_len = 0;
    plVar10 = (leaf_node<int,_true> *)malloc(0x18);
    (prVar9->tail).ptr = (leaf_node<int,_true> *)0x0;
    (prVar9->root).ptr = (tree_node<int,_true> *)0x0;
    plVar10->type = LEAF_NODE;
    plVar10->len = 0;
    plVar10->child = (int *)0x0;
    plVar10->guid = 0;
    LOCK();
    (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    LOCK();
    (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    (prVar9->tail).ptr = plVar10;
    LOCK();
    paVar20 = &plVar10->_ref_count;
    (paVar20->super___atomic_base<unsigned_int>)._M_i =
         (paVar20->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((paVar20->super___atomic_base<unsigned_int>)._M_i == 0) {
      free(plVar10);
    }
    LOCK();
    (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    prVar3 = in->ptr;
    local_50.ptr = prVar9;
    if (prVar3 != (rrb<int,_true,_5> *)0x0) {
      rrb_drop_left_rec<int,true,5>
                ((rrb_details *)&local_48,&prVar9->shift,&prVar3->root,left,prVar3->shift,false);
      p_node.ptr = local_48.ptr;
      if (local_48.ptr != (rrb<int,_true,_5> *)0x0) {
        LOCK();
        (local_48.ptr)->tail_len = (local_48.ptr)->tail_len + 1;
        UNLOCK();
      }
      ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_48);
      if (local_50.ptr != (rrb<int,_true,_5> *)0x0) {
        (local_50.ptr)->cnt = uVar18;
        if (p_node.ptr != (rrb<int,_true,_5> *)0x0) {
          LOCK();
          (p_node.ptr)->tail_len = (p_node.ptr)->tail_len + 1;
          UNLOCK();
        }
        local_48.ptr = (rrb<int,_true,_5> *)((local_50.ptr)->root).ptr;
        ((local_50.ptr)->root).ptr = (tree_node<int,_true> *)p_node.ptr;
        ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_48);
        if (local_50.ptr != (rrb<int,_true,_5> *)0x0) {
          if ((local_50.ptr)->shift == 0) {
            prVar9 = in->ptr;
LAB_00118de4:
            if (prVar9 == (rrb<int,_true,_5> *)0x0) goto LAB_0011918b;
          }
          else {
            if (p_node.ptr == (rrb<int,_true,_5> *)0x0) {
              __function = 
              "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
              ;
              goto LAB_001191a0;
            }
            plVar10 = ((p_node.ptr)->tail).ptr;
            prVar9 = in->ptr;
            if (plVar10 == (leaf_node<int,_true> *)0x0) goto LAB_00118de4;
            if (prVar9 == (rrb<int,_true,_5> *)0x0) goto LAB_0011918b;
            *(uint32_t *)(*(long *)plVar10 + (ulong)((p_node.ptr)->shift - 1) * 4) =
                 (local_50.ptr)->cnt - prVar9->tail_len;
          }
          ref<immutable::rrb_details::leaf_node<int,_true>_>::operator=
                    (&(local_50.ptr)->tail,&prVar9->tail);
          if ((in->ptr != (rrb<int,_true,_5> *)0x0) && (local_50.ptr != (rrb<int,_true,_5> *)0x0)) {
            (local_50.ptr)->tail_len = in->ptr->tail_len;
            LOCK();
            ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
                 ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
            local_48 = (ref<immutable::rrb<int,_true,_5>_>)in->ptr;
            in->ptr = (rrb<int,_true,_5> *)local_50;
            ref<immutable::rrb<int,_true,_5>_>::~ref(&local_48);
            release<int>((internal_node<int,_true> *)p_node.ptr);
            ref<immutable::rrb<int,_true,_5>_>::~ref(&local_50);
            prVar9 = in->ptr;
            if (prVar9 != (rrb<int,_true,_5> *)0x0) goto LAB_00118e4f;
          }
        }
      }
    }
    goto LAB_0011918b;
  }
LAB_00118e4f:
  if ((prVar9->shift != 0) ||
     (prVar3 = (rrb<int,_true,_5> *)(prVar9->root).ptr, prVar3 == (rrb<int,_true,_5> *)0x0))
  goto LAB_00118e56;
  uVar21 = prVar9->cnt;
  uVar17 = (ulong)uVar21;
  if (uVar17 < 0x21) {
    plVar13 = (leaf_node<int,_true> *)malloc(uVar17 * 4 + 0x18);
    plVar13->len = uVar21;
    plVar13->type = LEAF_NODE;
    plVar10 = plVar13 + 1;
    plVar13->child = (int *)plVar10;
    plVar13->guid = 0;
    if (uVar21 != 0) {
      memset(plVar10,0,uVar17 << 2);
    }
    LOCK();
    (plVar13->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    uVar21 = prVar3->shift;
    if ((ulong)uVar21 != 0) {
      plVar14 = (prVar3->tail).ptr;
      uVar17 = 0;
      do {
        (&plVar10->type)[uVar17] = (&plVar14->type)[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar21);
    }
    if (prVar9->tail_len != 0) {
      plVar14 = (prVar9->tail).ptr;
      if (plVar14 == (leaf_node<int,_true> *)0x0) {
LAB_001191aa:
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
        ;
        goto LAB_001191a0;
      }
      piVar4 = plVar14->child;
      uVar17 = 0;
      do {
        (&plVar10->type)[uVar21 + (int)uVar17] = piVar4[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar17 < prVar9->tail_len);
    }
    prVar9->tail_len = prVar9->cnt;
    local_50.ptr = (rrb<int,_true,_5> *)0x0;
    (prVar9->root).ptr = (tree_node<int,_true> *)0x0;
    local_48.ptr = prVar3;
    ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_48);
    ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_50);
    prVar9 = in->ptr;
    if (prVar9 == (rrb<int,_true,_5> *)0x0) {
LAB_0011918b:
      __function = 
      "T *immutable::ref<immutable::rrb<int>>::operator->() const [T = immutable::rrb<int>]";
LAB_001191a0:
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,__function);
    }
    LOCK();
    (plVar13->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (plVar13->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    paVar20 = &plVar13->_ref_count;
    plVar14 = (prVar9->tail).ptr;
    (prVar9->tail).ptr = plVar13;
    local_40 = plVar13;
    if (plVar14 != (leaf_node<int,_true> *)0x0) {
      LOCK();
      paVar22 = &plVar14->_ref_count;
      (paVar22->super___atomic_base<unsigned_int>)._M_i =
           (paVar22->super___atomic_base<unsigned_int>)._M_i - 1;
      _Var1 = (paVar22->super___atomic_base<unsigned_int>)._M_i;
      UNLOCK();
      goto joined_r0x00119169;
    }
  }
  else {
    if (0x1f < uVar21 - prVar9->tail_len) goto LAB_00118e56;
    local_38 = prVar3->shift;
    uVar21 = 0x20 - local_38;
    local_40 = (leaf_node<int,_true> *)malloc(0x98);
    local_40->type = LEAF_NODE;
    local_40->len = 0x20;
    plVar10 = local_40 + 1;
    local_40->child = (int *)plVar10;
    local_40->guid = 0;
    local_40[1].type = LEAF_NODE;
    local_40[1].len = 0;
    local_40[1]._ref_count = (__atomic_base<unsigned_int>)0x0;
    local_40[1].guid = 0;
    local_40[1].child = (int *)0x0;
    local_40[2].type = LEAF_NODE;
    local_40[2].len = 0;
    local_40[2]._ref_count = (__atomic_base<unsigned_int>)0x0;
    local_40[2].guid = 0;
    local_40[2].child = (int *)0x0;
    local_40[3].type = LEAF_NODE;
    local_40[3].len = 0;
    local_40[3]._ref_count = (__atomic_base<unsigned_int>)0x0;
    local_40[3].guid = 0;
    local_40[3].child = (int *)0x0;
    local_40[4].type = LEAF_NODE;
    local_40[4].len = 0;
    local_40[4]._ref_count = (__atomic_base<unsigned_int>)0x0;
    local_40[4].guid = 0;
    local_40[4].child = (int *)0x0;
    local_40[5].type = LEAF_NODE;
    local_40[5].len = 0;
    local_40[5]._ref_count = (__atomic_base<unsigned_int>)0x0;
    local_40[5].guid = 0;
    local_40[5].child = (int *)0x0;
    local_40[6].type = LEAF_NODE;
    local_40[6].len = 0;
    local_34 = 1;
    LOCK();
    (local_40->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    uVar19 = prVar9->tail_len;
    uVar17 = (ulong)(uVar19 - uVar21);
    plVar14 = (leaf_node<int,_true> *)malloc(uVar17 * 4 + 0x18);
    plVar13 = plVar14 + 1;
    uVar19 = uVar19 - uVar21;
    plVar14->len = uVar19;
    plVar14->type = LEAF_NODE;
    plVar14->child = (int *)plVar13;
    plVar14->guid = 0;
    if (uVar19 != 0) {
      memset(plVar13,0,uVar17 << 2);
    }
    plVar8 = local_40;
    LOCK();
    (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i = local_34;
    UNLOCK();
    ptVar5 = (prVar9->root).ptr;
    if (ptVar5 == (tree_node<int,_true> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::tree_node<int, true>>::operator->() const [T = immutable::rrb_details::tree_node<int, true>]"
      ;
      goto LAB_001191a0;
    }
    if (ptVar5->len != 0) {
      lVar6 = *(long *)(ptVar5 + 1);
      uVar17 = 0;
      do {
        (&plVar10->type)[uVar17] = *(node_type *)(lVar6 + uVar17 * 4);
        uVar17 = uVar17 + 1;
      } while (uVar17 < ptVar5->len);
    }
    if (local_38 != 0x20) {
      plVar7 = (prVar9->tail).ptr;
      if (plVar7 == (leaf_node<int,_true> *)0x0) goto LAB_001191aa;
      piVar4 = plVar7->child;
      uVar17 = 0;
      do {
        (&plVar10->type)[ptVar5->len + (int)uVar17] = piVar4[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar21 != uVar17);
    }
    uVar18 = 0;
    if (prVar9->tail_len != uVar21) {
      plVar10 = (prVar9->tail).ptr;
      if (plVar10 == (leaf_node<int,_true> *)0x0) goto LAB_001191aa;
      piVar4 = plVar10->child;
      uVar17 = 0;
      do {
        (&plVar13->type)[uVar17] = piVar4[uVar21 + (int)uVar17];
        uVar17 = uVar17 + 1;
        uVar18 = prVar9->tail_len - uVar21;
      } while (uVar17 < uVar18);
    }
    prVar9->tail_len = uVar18;
    LOCK();
    (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    plVar10 = (prVar9->tail).ptr;
    (prVar9->tail).ptr = plVar14;
    if (plVar10 != (leaf_node<int,_true> *)0x0) {
      LOCK();
      paVar20 = &plVar10->_ref_count;
      (paVar20->super___atomic_base<unsigned_int>)._M_i =
           (paVar20->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar20->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(plVar10);
      }
    }
    prVar9 = in->ptr;
    if (prVar9 == (rrb<int,_true,_5> *)0x0) goto LAB_0011918b;
    paVar20 = &plVar8->_ref_count;
    paVar22 = &plVar14->_ref_count;
    LOCK();
    (plVar8->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (plVar8->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    local_48.ptr = (rrb<int,_true,_5> *)(prVar9->root).ptr;
    (prVar9->root).ptr = (tree_node<int,_true> *)plVar8;
    ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_48);
    LOCK();
    (paVar22->super___atomic_base<unsigned_int>)._M_i =
         (paVar22->super___atomic_base<unsigned_int>)._M_i - 1;
    _Var1 = (paVar22->super___atomic_base<unsigned_int>)._M_i;
    UNLOCK();
joined_r0x00119169:
    if (_Var1 == 0) {
      free(plVar14);
    }
  }
  LOCK();
  (paVar20->super___atomic_base<unsigned_int>)._M_i =
       (paVar20->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  if ((paVar20->super___atomic_base<unsigned_int>)._M_i == 0) {
    free(local_40);
  }
LAB_00118e56:
  prVar9 = in->ptr;
  *(rrb<int,_true,_5> **)this = prVar9;
  if (prVar9 != (rrb<int,_true,_5> *)0x0) {
    LOCK();
    (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }